

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.hpp
# Opt level: O2

create_file_entry * __thiscall
libtorrent::create_file_entry::operator=(create_file_entry *this,create_file_entry *param_1)

{
  file_flags_t fVar1;
  undefined7 uVar2;
  
  ::std::__cxx11::string::operator=((string *)this,(string *)param_1);
  fVar1.m_val = (param_1->flags).m_val;
  uVar2 = *(undefined7 *)&param_1->field_0x29;
  this->size = param_1->size;
  this->flags = (file_flags_t)fVar1.m_val;
  *(undefined7 *)&this->field_0x29 = uVar2;
  this->mtime = param_1->mtime;
  ::std::__cxx11::string::operator=((string *)&this->symlink,(string *)&param_1->symlink);
  return this;
}

Assistant:

struct TORRENT_EXPORT create_file_entry
	{
		create_file_entry(std::string fn, std::int64_t const sz
			, file_flags_t const f = {}, std::time_t const ts = 0, std::string sl = {})
			: filename(std::move(fn))
			, size(sz)
			, flags(f)
			, mtime(ts)
			, symlink(std::move(sl))
		{}

		// the path and name of the file. The path is relative to the root of
		// the torrent file.
		std::string filename;
		// the size of the file
		std::int64_t size;

		file_flags_t flags;

		std::time_t mtime;

		// only considered if the symlink flag is set
		std::string symlink;
	}